

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O1

PortConnectionSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *this,size_t index)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  PortConnectionSyntax *pPVar2;
  
  if (index * 2 < (this->elements).size_) {
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         ((this->elements).data_ + index * 2));
    pPVar2 = SyntaxNode::as<slang::syntax::PortConnectionSyntax>(*ppSVar1);
    return pPVar2;
  }
  std::terminate();
}

Assistant:

const T* operator[](size_t index) const {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }